

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O3

void __thiscall deqp::gls::StateChangePerformanceCase::deinit(StateChangePerformanceCase *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  ShaderProgram *this_00;
  int iVar5;
  undefined4 extraout_var;
  pointer ppSVar6;
  pointer ppSVar7;
  long lVar8;
  
  puVar1 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  puVar2 = (this->m_interleavedResults).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_interleavedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->m_interleavedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (this->m_batchedResults).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->m_batchedResults).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  iVar5 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  puVar3 = (this->m_indexBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_indexBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x438))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_indexBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_indexBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_indexBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar3;
    }
  }
  puVar3 = (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x438))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_coordBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar3;
    }
  }
  puVar3 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x480))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->m_textures).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
  }
  puVar3 = (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x440))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_framebuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar3;
    }
  }
  puVar3 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x460))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_renderbuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar3;
    }
  }
  puVar3 = (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x468))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->m_samplers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
  }
  puVar3 = (this->m_vertexArrays).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->m_vertexArrays).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar3 != puVar4) {
    (**(code **)(lVar8 + 0x490))((ulong)((long)puVar4 - (long)puVar3) >> 2);
    puVar3 = (this->m_vertexArrays).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_vertexArrays).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar3) {
      (this->m_vertexArrays).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_finish = puVar3;
    }
  }
  ppSVar6 = (this->m_programs).
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar7 = (this->m_programs).
            super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppSVar7 - (long)ppSVar6) >> 3)) {
    lVar8 = 0;
    do {
      this_00 = ppSVar6[lVar8];
      if (this_00 != (ShaderProgram *)0x0) {
        glu::ShaderProgram::~ShaderProgram(this_00);
      }
      operator_delete(this_00,0xd0);
      (this->m_programs).
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8] = (ShaderProgram *)0x0;
      lVar8 = lVar8 + 1;
      ppSVar6 = (this->m_programs).
                super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppSVar7 = (this->m_programs).
                super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar8 < (int)((ulong)((long)ppSVar7 - (long)ppSVar6) >> 3));
  }
  if (ppSVar7 != ppSVar6) {
    (this->m_programs).
    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar6;
  }
  return;
}

Assistant:

void StateChangePerformanceCase::deinit (void)
{
	m_indices.clear();
	m_interleavedResults.clear();
	m_batchedResults.clear();

	{
		const glw::Functions& gl = m_renderCtx.getFunctions();

		if (!m_indexBuffers.empty())
		{
			gl.deleteBuffers((GLsizei)m_indexBuffers.size(), &(m_indexBuffers[0]));
			m_indexBuffers.clear();
		}

		if (!m_coordBuffers.empty())
		{
			gl.deleteBuffers((GLsizei)m_coordBuffers.size(), &(m_coordBuffers[0]));
			m_coordBuffers.clear();
		}

		if (!m_textures.empty())
		{
			gl.deleteTextures((GLsizei)m_textures.size(), &(m_textures[0]));
			m_textures.clear();
		}

		if (!m_framebuffers.empty())
		{
			gl.deleteFramebuffers((GLsizei)m_framebuffers.size(), &(m_framebuffers[0]));
			m_framebuffers.clear();
		}

		if (!m_renderbuffers.empty())
		{
			gl.deleteRenderbuffers((GLsizei)m_renderbuffers.size(), &(m_renderbuffers[0]));
			m_renderbuffers.clear();
		}

		if (!m_samplers.empty())
		{
			gl.deleteSamplers((GLsizei)m_samplers.size(), &m_samplers[0]);
			m_samplers.clear();
		}

		if (!m_vertexArrays.empty())
		{
			gl.deleteVertexArrays((GLsizei)m_vertexArrays.size(), &m_vertexArrays[0]);
			m_vertexArrays.clear();
		}

		for (int programNdx = 0; programNdx < (int)m_programs.size(); programNdx++)
		{
			delete m_programs[programNdx];
			m_programs[programNdx] = NULL;
		}
		m_programs.clear();
	}
}